

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O2

void __thiscall xLearn::SquaredLoss::CalcGrad(SquaredLoss *this,DMatrix *matrix,Model *model)

{
  index_t *piVar1;
  size_t gap;
  size_type sVar2;
  ostream *poVar3;
  size_type sVar4;
  uint uVar5;
  long lVar6;
  size_type __n;
  long lVar7;
  real_t rVar8;
  allocator local_c2;
  allocator local_c1;
  Logger local_c0;
  uint local_bc;
  vector<float,_std::allocator<float>_> sum;
  string local_98;
  undefined1 local_78;
  Score *local_70;
  Model *local_68;
  DMatrix *local_60;
  ulong local_58;
  DMatrix *local_50;
  Model *local_48;
  
  local_48 = model;
  if (matrix == (DMatrix *)0x0) {
    local_c0.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/squared_loss.cc"
               ,&local_c1);
    std::__cxx11::string::string((string *)&sum,"CalcGrad",&local_c2);
    poVar3 = Logger::Start(ERR,&local_98,0x76,(string *)&sum);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x76);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"matrix");
    std::operator<<(poVar3," == NULL \n");
  }
  else {
    local_58 = (ulong)matrix->row_length;
    if (local_58 != 0) {
      piVar1 = &(this->super_Loss).total_example_;
      *piVar1 = *piVar1 + matrix->row_length;
      if ((this->super_Loss).lock_free_ == false) {
        uVar5 = 1;
      }
      else {
        uVar5 = (uint)(this->super_Loss).threadNumber_;
      }
      __n = (size_type)(int)uVar5;
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffff00000000;
      local_50 = matrix;
      std::vector<float,_std::allocator<float>_>::vector
                (&sum,__n,(value_type_conflict1 *)&local_98,(allocator_type *)&local_c0);
      lVar6 = 0;
      sVar4 = __n;
      local_bc = uVar5;
      for (lVar7 = 0; sVar4 = sVar4 - 1, (ulong)(~((int)uVar5 >> 0x1f) & uVar5) << 2 != lVar7;
          lVar7 = lVar7 + 4) {
        local_98._M_dataplus._M_p = (pointer)sq_gradient_thread;
        local_98.field_2._M_allocated_capacity = (local_58 / __n) * lVar6;
        lVar6 = lVar6 + 1;
        sVar2 = (local_58 / __n) * lVar6;
        local_98._M_string_length = local_58 % __n + sVar2;
        if (sVar4 != 0) {
          local_98._M_string_length = sVar2;
        }
        local_98.field_2._8_8_ =
             (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar7;
        local_78 = (this->super_Loss).norm_;
        local_70 = (this->super_Loss).score_func_;
        local_68 = local_48;
        local_60 = local_50;
        ThreadPool::
        enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>
                  ((ThreadPool *)&stack0xffffffffffffffc0,
                   (_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>
                    *)(this->super_Loss).pool_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      }
      ThreadPool::Sync((this->super_Loss).pool_,local_bc);
      rVar8 = (this->super_Loss).loss_sum_;
      for (lVar6 = 0;
          (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != lVar6; lVar6 = lVar6 + 1) {
        rVar8 = rVar8 + sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6];
        (this->super_Loss).loss_sum_ = rVar8;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&sum.super__Vector_base<float,_std::allocator<float>_>);
      return;
    }
    local_c0.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/squared_loss.cc"
               ,&local_c1);
    std::__cxx11::string::string((string *)&sum,"CalcGrad",&local_c2);
    poVar3 = Logger::Start(ERR,&local_98,0x77,(string *)&sum);
    poVar3 = std::operator<<(poVar3,"CHECK_GT failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x77);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"matrix->row_length");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&sum);
  std::__cxx11::string::~string((string *)&local_98);
  Logger::~Logger(&local_c0);
  abort();
}

Assistant:

void SquaredLoss::CalcGrad(const DMatrix* matrix,
                           Model& model) {
  CHECK_NOTNULL(matrix);
  CHECK_GT(matrix->row_length, 0);
  size_t row_len = matrix->row_length;
  total_example_ += row_len;
  int count = lock_free_ ? threadNumber_ : 1;
  std::vector<real_t> sum(count, 0);
  for (int i = 0; i < count; ++i) {
    size_t start = getStart(row_len, count, i);
    size_t end = getEnd(row_len, count, i);
    pool_->enqueue(std::bind(sq_gradient_thread,
                             matrix,
                             &model,
                             score_func_,
                             norm_,
                             &(sum[i]),
                             start,
                             end));
  }
  // Wait all of the threads finish their job
  pool_->Sync(count);
  // Accumulate loss
  for (int i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}